

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmGeneratorTarget *pcVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  cmOSXBundleGenerator *pcVar4;
  MacOSXContentGeneratorType *pMVar5;
  cmLocalUnixMakefileGenerator3 *pcVar6;
  _Base_ptr p_Var7;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  pointer puVar8;
  bool bVar9;
  cmValue cVar10;
  string *psVar11;
  _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
  *this_01;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar13;
  string *psVar14;
  cmFileSet *this_02;
  mapped_type *pmVar15;
  _Rb_tree_node_base *p_Var16;
  iterator iVar17;
  pointer ppcVar18;
  string *output;
  pointer pbVar19;
  pointer cge;
  string *ispcObj;
  _Base_ptr __k;
  pointer ppcVar20;
  iterator __begin2;
  cmSourceFile *pcVar21;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  pair<std::_Rb_tree_iterator<const_cmSourceFile_*>,_bool> pVar22;
  string_view str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  undefined8 in_stack_fffffffffffffc20;
  cmMakefileTargetGenerator *pcVar23;
  cmMakefileTargetGenerator *this_03;
  cmSourceFile *pcVar24;
  cmTarget *this_04;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredLangs;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  cmSourceFile *sf;
  cmSourceFile *local_368;
  anon_class_8_1_8991fb9c evaluatedFiles;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcAdditionalObjs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_set_map;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  _Any_data local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_50;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&file_set_map,this);
  cmGeneratorTarget::CheckCxxModuleStatus(pcVar1,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  evaluatedFiles.this = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_set_map,"ADDITIONAL_MAKE_CLEAN_FILES",(allocator<char> *)&requiredLangs
            );
  cVar10 = cmMakefile::GetProperty(pcVar2,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  if (cVar10.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((cmList *)&file_set_map,&evaluatedFiles,cVar10.Value);
    __last._M_current._4_4_ = file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
    __last._M_current._0_4_ = file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->CleanFiles,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )file_set_map._M_t._M_impl._0_8_,__last);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&file_set_map);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_set_map,"ADDITIONAL_CLEAN_FILES",(allocator<char> *)&requiredLangs);
  cVar10 = cmGeneratorTarget::GetProperty(pcVar1,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  pcVar23 = this;
  if (cVar10.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((cmList *)&requiredLangs,&evaluatedFiles,cVar10.Value);
    pcVar23 = this;
    psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)this->LocalGenerator);
    psVar14 = (string *)
              CONCAT44(requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                       requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
    for (; (string *)requiredLangs._M_t._M_impl._0_8_ != psVar14;
        requiredLangs._M_t._M_impl._0_8_ = requiredLangs._M_t._M_impl._0_8_ + 0x20) {
      cmsys::SystemTools::CollapseFullPath
                ((string *)&file_set_map,(string *)requiredLangs._M_t._M_impl._0_8_,psVar11);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->CleanFiles,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&requiredLangs);
  }
  pcVar1 = (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget;
  this_03 = pcVar23;
  GetConfigName_abi_cxx11_((string *)&file_set_map,pcVar23);
  cmGeneratorTarget::GetGeneratedISPCObjects(&ispcAdditionalObjs,pcVar1,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  this_00 = &pcVar23->CleanFiles;
  for (; ispcAdditionalObjs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         ispcAdditionalObjs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      ispcAdditionalObjs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           ispcAdditionalObjs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)&file_set_map,(cmOutputConverter *)this_03->LocalGenerator,
               ispcAdditionalObjs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,(string *)&file_set_map);
    std::__cxx11::string::~string((string *)&file_set_map);
  }
  pcVar2 = (this_03->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_set_map,"CLEAN_NO_CUSTOM",(allocator<char> *)&sf);
  requiredLangs._M_t._M_impl._0_8_ = cmMakefile::GetProperty(pcVar2,(string *)&file_set_map);
  bVar9 = cmValue::IsOff((cmValue *)&requiredLangs);
  std::__cxx11::string::~string((string *)&file_set_map);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (this_03->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&file_set_map,this_03);
  cmGeneratorTarget::GetCustomCommands(pcVar1,&customCommands,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  ppcVar18 = customCommands.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppcVar20 = customCommands.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  do {
    if (ppcVar18 == ppcVar20) {
      if (bVar9) {
        pvVar13 = cmGeneratorTarget::GetPreBuildCommands
                            ((this_03->super_cmCommonTargetGenerator).GeneratorTarget);
        std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
                  ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&sf,pvVar13);
        pvVar13 = cmGeneratorTarget::GetPreLinkCommands
                            ((this_03->super_cmCommonTargetGenerator).GeneratorTarget);
        ::cm::
        append<std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_0>
                  ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&sf,pvVar13);
        pvVar13 = cmGeneratorTarget::GetPostBuildCommands
                            ((this_03->super_cmCommonTargetGenerator).GeneratorTarget);
        ::cm::
        append<std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_0>
                  ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&sf,pvVar13);
        pcVar24 = local_368;
        for (pcVar21 = sf; pcVar21 != pcVar24;
            pcVar21 = (cmSourceFile *)&pcVar21->CompileDefinitions) {
          pcVar23 = this_03;
          GetConfigName_abi_cxx11_(&local_50,this_03);
          local_a0._M_engaged = false;
          local_108._M_unused._M_object = (void *)0x0;
          local_108._8_8_ = 0;
          local_f8 = 0;
          uStack_f0 = 0;
          computeInternalDepfile_00.super__Function_base._M_functor._8_8_ =
               in_stack_fffffffffffffc20;
          computeInternalDepfile_00.super__Function_base._M_functor._M_unused._M_object = &local_108
          ;
          computeInternalDepfile_00.super__Function_base._M_manager = (_Manager_type)pcVar23;
          computeInternalDepfile_00._M_invoker = (_Invoker_type)pcVar24;
          cmCustomCommandGenerator::cmCustomCommandGenerator
                    ((cmCustomCommandGenerator *)&file_set_map,(cmCustomCommand *)pcVar21,&local_50,
                     (cmLocalGenerator *)this_03->LocalGenerator,true,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,computeInternalDepfile_00);
          std::_Function_base::~_Function_base((_Function_base *)&local_108);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_a0);
          std::__cxx11::string::~string((string *)&local_50);
          pvVar12 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                              ((cmCustomCommandGenerator *)&file_set_map);
          pbVar3 = (pvVar12->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar19 = (pvVar12->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar19 != pbVar3;
              pbVar19 = pbVar19 + 1) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      ((string *)&requiredLangs,(cmOutputConverter *)pcVar23->LocalGenerator,pbVar19
                      );
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)this_00,(string *)&requiredLangs);
            std::__cxx11::string::~string((string *)&requiredLangs);
          }
          cmCustomCommandGenerator::~cmCustomCommandGenerator
                    ((cmCustomCommandGenerator *)&file_set_map);
          this_03 = pcVar23;
        }
        std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
                  ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&sf);
      }
      headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (this_03->super_cmCommonTargetGenerator).GeneratorTarget;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_03);
      cmGeneratorTarget::GetHeaderSources(pcVar1,&headerSources,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      pcVar4 = (this_03->OSXBundleGenerator)._M_t.
               super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
               .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
      pMVar5 = (this_03->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
               .
               super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>
               ._M_head_impl;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_03);
      cmOSXBundleGenerator::GenerateMacOSXContentStatements
                (pcVar4,&headerSources,&pMVar5->super_MacOSXContentGeneratorType,
                 (string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (this_03->super_cmCommonTargetGenerator).GeneratorTarget;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_03);
      cmGeneratorTarget::GetExtraSources(pcVar1,&extraSources,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      pcVar4 = (this_03->OSXBundleGenerator)._M_t.
               super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
               .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
      pMVar5 = (this_03->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
               .
               super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>
               ._M_head_impl;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_03);
      cmOSXBundleGenerator::GenerateMacOSXContentStatements
                (pcVar4,&extraSources,&pMVar5->super_MacOSXContentGeneratorType,
                 (string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      pcVar2 = (this_03->super_cmCommonTargetGenerator).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&file_set_map,"CMAKE_PCH_EXTENSION",(allocator<char> *)&requiredLangs);
      cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (this_03->super_cmCommonTargetGenerator).GeneratorTarget;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_03);
      cmGeneratorTarget::GetExternalObjects(pcVar1,&externalObjects,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      ppcVar18 = externalObjects.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      pvVar12 = &this_03->ExternalObjects;
      for (ppcVar20 = externalObjects.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar20 != ppcVar18;
          ppcVar20 = ppcVar20 + 1) {
        psVar14 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar20);
        str._M_str = (psVar14->_M_dataplus)._M_p;
        str._M_len = psVar14->_M_string_length;
        bVar9 = cmHasSuffix(str,cVar10);
        if (!bVar9) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvVar12,psVar14);
        }
      }
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &file_set_map._M_t._M_impl.super__Rb_tree_header._M_header;
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      this_04 = ((this_03->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cmTarget::GetAllFileSetNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&objectSources,this_04);
      for (psVar14 = (string *)
                     objectSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          psVar14 !=
          (string *)
          objectSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish; psVar14 = psVar14 + 1) {
        this_02 = cmTarget::GetFileSet(this_04,psVar14);
        if (this_02 == (cmFileSet *)0x0) {
          pcVar2 = (this_03->super_cmCommonTargetGenerator).Makefile;
          psVar11 = cmTarget::GetName_abi_cxx11_(this_04);
          cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[32],std::__cxx11::string_const&,char_const(&)[25]>
                    ((string *)&requiredLangs,(char (*) [9])0x725759,psVar11,
                     (char (*) [32])"\" is tracked to have file set \"",psVar14,
                     (char (*) [25])"\", but it was not found.");
          cmMakefile::IssueMessage(pcVar2,INTERNAL_ERROR,(string *)&requiredLangs);
          std::__cxx11::string::~string((string *)&requiredLangs);
        }
        else {
          cmFileSet::CompileFileEntries(&fileEntries,this_02);
          cmFileSet::CompileDirectoryEntries(&directoryEntries,this_02);
          pcVar6 = this_03->LocalGenerator;
          pcVar23 = this_03;
          GetConfigName_abi_cxx11_((string *)&requiredLangs,this_03);
          cmFileSet::EvaluateDirectoryEntries
                    (&directories,this_02,&directoryEntries,(cmLocalGenerator *)pcVar6,
                     (string *)&requiredLangs,
                     (this_03->super_cmCommonTargetGenerator).GeneratorTarget,
                     (cmGeneratorExpressionDAGChecker *)0x0);
          std::__cxx11::string::~string((string *)&requiredLangs);
          puVar8 = fileEntries.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          this_03 = pcVar23;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (cge = fileEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              p_Var16 = requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
              cge != puVar8; cge = cge + 1) {
            pcVar6 = this_03->LocalGenerator;
            pcVar23 = this_03;
            GetConfigName_abi_cxx11_((string *)&sf,this_03);
            cmFileSet::EvaluateFileEntry
                      (this_02,&directories,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&requiredLangs,cge,(cmLocalGenerator *)pcVar6,(string *)&sf,
                       (this_03->super_cmCommonTargetGenerator).GeneratorTarget,
                       (cmGeneratorExpressionDAGChecker *)0x0);
            std::__cxx11::string::~string((string *)&sf);
            this_03 = pcVar23;
          }
          for (; (_Rb_tree_header *)p_Var16 != &requiredLangs._M_t._M_impl.super__Rb_tree_header;
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
            p_Var7 = p_Var16[2]._M_parent;
            for (__k = *(_Base_ptr *)(p_Var16 + 2); __k != p_Var7; __k = __k + 1) {
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&file_set_map,(key_type *)__k);
              std::__cxx11::string::_M_assign((string *)pmVar15);
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)&requiredLangs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&directories);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&directoryEntries);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&fileEntries);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&objectSources);
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (this_03->super_cmCommonTargetGenerator).GeneratorTarget;
      GetConfigName_abi_cxx11_((string *)&requiredLangs,this_03);
      cmGeneratorTarget::GetObjectSources(pcVar1,&objectSources,(string *)&requiredLangs);
      std::__cxx11::string::~string((string *)&requiredLangs);
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header;
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar9 = cmCommonTargetGenerator::HaveRequiredLanguages
                        (&this_03->super_cmCommonTargetGenerator,&objectSources,&requiredLangs);
      ppcVar18 = objectSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      ppcVar20 = objectSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (bVar9) {
        for (; ppcVar20 != ppcVar18; ppcVar20 = ppcVar20 + 1) {
          WriteObjectRuleFiles(this_03,*ppcVar20);
        }
      }
      ppcVar18 = objectSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar20 = objectSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar20 != ppcVar18;
          ppcVar20 = ppcVar20 + 1) {
        pcVar21 = *ppcVar20;
        psVar14 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar21);
        iVar17 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&file_set_map._M_t,psVar14);
        if (((_Rb_tree_header *)iVar17._M_node != &file_set_map._M_t._M_impl.super__Rb_tree_header)
           && (__y._M_str = "CXX_MODULES", __y._M_len = 0xb,
              __x._M_str = *(char **)(iVar17._M_node + 2),
              __x._M_len = (size_t)iVar17._M_node[2]._M_parent, bVar9 = std::operator==(__x,__y),
              bVar9)) {
          cmSourceFile::GetLanguage_abi_cxx11_((string *)&sf,pcVar21);
          __y_00._M_str = "CXX";
          __y_00._M_len = 3;
          __x_00._M_str = (char *)sf;
          __x_00._M_len = (size_t)local_368;
          bVar9 = std::operator!=(__x_00,__y_00);
          std::__cxx11::string::~string((string *)&sf);
          if (bVar9) {
            pcVar2 = (this_03->super_cmCommonTargetGenerator).Makefile;
            psVar11 = cmTarget::GetName_abi_cxx11_(this_04);
            cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[25],std::__cxx11::string_const&,char_const(&)[25],std::__cxx11::string_const&,char_const(&)[54]>
                      ((string *)&sf,(char (*) [9])0x725759,psVar11,
                       (char (*) [25])"\" contains the source\n  ",psVar14,
                       (char (*) [25])"\nin a file set of type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (iVar17._M_node + 2),
                       (char (*) [54])"\" but the source is not classified as a \"CXX\" source.");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&sf);
            std::__cxx11::string::~string((string *)&sf);
          }
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&requiredLangs._M_t);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&objectSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&file_set_map._M_t);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&externalObjects.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&extraSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&headerSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ispcAdditionalObjs);
      return;
    }
    sf = *ppcVar18;
    pcVar23 = this_03;
    if ((code)this_03->CMP0113New == (code)0x1) {
      this_01 = (_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                 *)cmLocalUnixMakefileGenerator3::GetCommandsVisited
                             (this_03->LocalGenerator,
                              (this_03->super_cmCommonTargetGenerator).GeneratorTarget);
      pVar22 = std::
               _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
               ::_M_insert_unique<cmSourceFile_const*const&>(this_01,&sf);
      pcVar23 = this_03;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_004dac9c;
    }
    else {
LAB_004dac9c:
      cc = cmSourceFile::GetCustomCommand(sf);
      this_03 = pcVar23;
      GetConfigName_abi_cxx11_(&local_c0,pcVar23);
      local_78._M_engaged = false;
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc20;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_e8;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)this_03;
      computeInternalDepfile._M_invoker = (_Invoker_type)ppcVar20;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&file_set_map,cc,&local_c0,
                 (cmLocalGenerator *)pcVar23->LocalGenerator,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,computeInternalDepfile);
      std::_Function_base::~_Function_base((_Function_base *)&local_e8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_78);
      std::__cxx11::string::~string((string *)&local_c0);
      GenerateCustomRuleFile(pcVar23,(cmCustomCommandGenerator *)&file_set_map);
      if (bVar9) {
        pvVar12 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                            ((cmCustomCommandGenerator *)&file_set_map);
        pbVar3 = (pvVar12->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar19 = (pvVar12->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar19 != pbVar3;
            pbVar19 = pbVar19 + 1) {
          cmOutputConverter::MaybeRelativeToCurBinDir
                    ((string *)&requiredLangs,(cmOutputConverter *)this_03->LocalGenerator,pbVar19);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,(string *)&requiredLangs);
          std::__cxx11::string::~string((string *)&requiredLangs);
        }
        pvVar12 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)&file_set_map);
        pbVar3 = (pvVar12->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar19 = (pvVar12->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar19 != pbVar3;
            pbVar19 = pbVar19 + 1) {
          cmOutputConverter::MaybeRelativeToCurBinDir
                    ((string *)&requiredLangs,(cmOutputConverter *)this_03->LocalGenerator,pbVar19);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,(string *)&requiredLangs);
          std::__cxx11::string::~string((string *)&requiredLangs);
        }
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&file_set_map)
      ;
    }
    ppcVar18 = ppcVar18 + 1;
  } while( true );
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  this->GeneratorTarget->CheckCxxModuleStatus(this->GetConfigName());

  // -- Write the custom commands for this target

  // Evaluates generator expressions and expands prop_value
  auto evaluatedFiles = [this](const std::string& prop_value) -> cmList {
    cmList files{ cmGeneratorExpression::Evaluate(
      prop_value, this->LocalGenerator, this->GetConfigName(),
      this->GeneratorTarget) };
    return files;
  };

  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    auto const files = evaluatedFiles(*prop_value);
    this->CleanFiles.insert(files.begin(), files.end());
  }

  // Look for additional files registered for cleaning in this target.
  if (cmValue prop_value =
        this->GeneratorTarget->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    auto const files = evaluatedFiles(*prop_value);
    // For relative path support
    std::string const& binaryDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& cfl : files) {
      this->CleanFiles.insert(cmSystemTools::CollapseFullPath(cfl, binaryDir));
    }
  }

  // Look for ISPC extra object files generated by this target
  auto const ispcAdditionalObjs =
    this->GeneratorTarget->GetGeneratedISPCObjects(this->GetConfigName());
  for (std::string const& ispcObj : ispcAdditionalObjs) {
    this->CleanFiles.insert(
      this->LocalGenerator->MaybeRelativeToCurBinDir(ispcObj));
  }

  // add custom commands to the clean rules?
  bool const clean = this->Makefile->GetProperty("CLEAN_NO_CUSTOM").IsOff();

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands,
                                           this->GetConfigName());
  for (cmSourceFile const* sf : customCommands) {
    if (this->CMP0113New &&
        !this->LocalGenerator->GetCommandsVisited(this->GeneratorTarget)
           .insert(sf)
           .second) {
      continue;
    }
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(),
                                 this->GetConfigName(), this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPreLinkCommands());
    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPostBuildCommands());

    for (const auto& be : buildEventCommands) {
      cmCustomCommandGenerator beg(be, this->GetConfigName(),
                                   this->LocalGenerator);
      const std::vector<std::string>& byproducts = beg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources,
                                          this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects,
                                            this->GetConfigName());
  for (cmSourceFile const* sf : externalObjects) {
    auto const& objectFileName = sf->GetFullPath();
    if (!cmHasSuffix(objectFileName, pchExtension)) {
      this->ExternalObjects.push_back(objectFileName);
    }
  }

  std::map<std::string, std::string> file_set_map;

  auto const* tgt = this->GeneratorTarget->Target;
  for (auto const& name : tgt->GetAllFileSetNames()) {
    auto const* file_set = tgt->GetFileSet(name);
    if (!file_set) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", name,
                 "\", but it was not found."));
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();
    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->LocalGenerator, this->GetConfigName(),
      this->GeneratorTarget);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files, entry,
                                  this->LocalGenerator, this->GetConfigName(),
                                  this->GeneratorTarget);
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        file_set_map[filename] = file_set->GetType();
      }
    }
  }

  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources,
                                          this->GetConfigName());

  // validate that all languages requested are enabled.
  std::set<std::string> requiredLangs;
  if (this->HaveRequiredLanguages(objectSources, requiredLangs)) {
    for (cmSourceFile const* sf : objectSources) {
      // Generate this object file's rule file.
      this->WriteObjectRuleFiles(*sf);
    }
  }

  for (cmSourceFile const* sf : objectSources) {
    auto const& path = sf->GetFullPath();
    auto const it = file_set_map.find(path);
    if (it != file_set_map.end()) {
      auto const& file_set_type = it->second;
      if (file_set_type == "CXX_MODULES"_s) {
        if (sf->GetLanguage() != "CXX"_s) {
          this->Makefile->IssueMessage(
            MessageType::FATAL_ERROR,
            cmStrCat(
              "Target \"", tgt->GetName(), "\" contains the source\n  ", path,
              "\nin a file set of type \"", file_set_type,
              R"(" but the source is not classified as a "CXX" source.)"));
        }
      }
    }
  }
}